

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

FillStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_fillstatic(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x43d) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x43d;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x30);
    FillStaticLayerParams::FillStaticLayerParams(this_00.fillstatic_);
    (this->layer_).fillstatic_ = (FillStaticLayerParams *)this_00;
  }
  return (FillStaticLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::FillStaticLayerParams* NeuralNetworkLayer::mutable_fillstatic() {
  if (!has_fillstatic()) {
    clear_layer();
    set_has_fillstatic();
    layer_.fillstatic_ = new ::CoreML::Specification::FillStaticLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.fillStatic)
  return layer_.fillstatic_;
}